

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::paintEvent(QLineEdit *this,QPaintEvent *param_2)

{
  bool bVar1;
  bool bVar2;
  Int IVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ColorGroup CVar10;
  ColorGroup CVar11;
  QLineEditPrivate *pQVar12;
  QPalette *pQVar13;
  QStyle *pQVar14;
  int *piVar15;
  QColor *pQVar16;
  QPen *pQVar17;
  QStyleSheetStyle *pQVar18;
  long *in_RDI;
  long in_FS_OFFSET;
  QRect QVar19;
  int flags;
  QStyleSheetStyle *cssStyle;
  int widthUsed;
  int cix;
  LayoutDirection oldLayoutDir;
  LayoutDirection layoutDir;
  QLineEditPrivate *d;
  QPoint topLeft;
  QString elidedText;
  QPen oldpen;
  Alignment alignPhText;
  QRect lineRect;
  Alignment va;
  int fmHeight;
  QFontMetrics fm;
  QRect r;
  QPainter p;
  QColor col;
  QStyleOptionFrame panel;
  QPalette pal;
  QWidgetLineControl *in_stack_fffffffffffffd48;
  QWidgetLineControl *this_00;
  QWidgetLineControl *in_stack_fffffffffffffd50;
  QRect *in_stack_fffffffffffffd58;
  QPainter *this_01;
  undefined2 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd62;
  undefined1 in_stack_fffffffffffffd63;
  undefined4 in_stack_fffffffffffffd64;
  undefined1 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd69;
  byte bVar20;
  byte in_stack_fffffffffffffd6a;
  undefined1 in_stack_fffffffffffffd6b;
  byte bVar21;
  int in_stack_fffffffffffffd74;
  int in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  Int in_stack_fffffffffffffd8c;
  int iVar22;
  uint in_stack_fffffffffffffd94;
  QLineEditPrivate *in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int local_1b4;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1b0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_1ac;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  QFlag local_188 [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_180;
  undefined1 *local_17c;
  undefined1 *local_174;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_16c;
  QFlag local_168 [2];
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_160;
  int local_15c [32];
  undefined1 local_dc [16];
  undefined1 local_cc [16];
  int local_bc;
  undefined1 *local_b8;
  QMargins local_b0;
  QRect local_a0;
  undefined1 local_90 [16];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [80];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = d_func((QLineEdit *)0x5c75fe);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_80,(QPaintDevice *)(in_RDI + 2));
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar13 = QWidget::palette((QWidget *)in_stack_fffffffffffffd50);
  QPalette::QPalette((QPalette *)local_18,(QPalette *)pQVar13);
  memset(local_68,0xaa,0x50);
  QStyleOptionFrame::QStyleOptionFrame((QStyleOptionFrame *)0x5c7687);
  (**(code **)(*in_RDI + 0x1a0))(in_RDI,local_68);
  pQVar14 = QWidget::style((QWidget *)in_stack_fffffffffffffd48);
  (**(code **)(*(long *)pQVar14 + 0xb0))(pQVar14,0x12,local_68,&local_80,in_RDI);
  local_90._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_90._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pQVar14 = QWidget::style((QWidget *)in_stack_fffffffffffffd48);
  local_90 = (**(code **)(*(long *)pQVar14 + 0xc0))(pQVar14,0x1a,local_68,in_RDI);
  local_b0 = QLineEditPrivate::effectiveTextMargins(in_stack_fffffffffffffd98);
  QVar19 = QRect::marginsRemoved
                     ((QRect *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                      (QMargins *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  local_a0._0_8_ = QVar19._0_8_;
  local_90._0_4_ = local_a0.x1.m_i;
  local_90._4_4_ = local_a0.y1.m_i;
  local_a0._8_8_ = QVar19._8_8_;
  local_90._8_4_ = local_a0.x2.m_i;
  local_90._12_4_ = local_a0.y2.m_i;
  local_a0 = QVar19;
  QPainter::setClipRect((QRect *)&local_80,(ClipOperation)local_90);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)in_stack_fffffffffffffd48);
  local_bc = 0;
  bVar1 = QLineEditPrivate::shouldShowPlaceholderText
                    ((QLineEditPrivate *)
                     CONCAT44(in_stack_fffffffffffffd64,
                              CONCAT13(in_stack_fffffffffffffd63,
                                       CONCAT12(in_stack_fffffffffffffd62,in_stack_fffffffffffffd60)
                                      )));
  if (bVar1) {
    local_cc = QFontMetrics::boundingRect((QString *)&local_b8);
    local_bc = QRect::height((QRect *)in_stack_fffffffffffffd48);
  }
  else {
    QWidgetLineControl::text
              ((QWidgetLineControl *)
               CONCAT44(in_stack_fffffffffffffd64,
                        CONCAT13(in_stack_fffffffffffffd63,
                                 CONCAT12(in_stack_fffffffffffffd62,in_stack_fffffffffffffd60))));
    QWidgetLineControl::preeditAreaText(in_stack_fffffffffffffd48);
    ::operator+((QString *)in_stack_fffffffffffffd58,(QString *)in_stack_fffffffffffffd50);
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffffd48);
    local_dc = QFontMetrics::boundingRect((QString *)&local_b8);
    local_bc = QRect::height((QRect *)in_stack_fffffffffffffd48);
    QString::~QString((QString *)0x5c78d3);
    QStringBuilder<QString,_QString>::~QStringBuilder
              ((QStringBuilder<QString,_QString> *)in_stack_fffffffffffffd50);
    QString::~QString((QString *)0x5c78ed);
    QString::~QString((QString *)0x5c78fa);
  }
  local_15c[0] = QFontMetrics::height();
  piVar15 = qMax<int>(&local_bc,local_15c);
  local_bc = *piVar15;
  local_160.super_QFlagsStorage<Qt::AlignmentFlag>.i = (QFlagsStorage<Qt::AlignmentFlag>)0xaaaaaaaa;
  QWidgetLineControl::layoutDirection(in_stack_fffffffffffffd48);
  QFlag::QFlag(local_168,pQVar12->alignment);
  QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
            ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffd48,
             (QFlag)(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  local_160.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QStyle::visualAlignment
                 ((LayoutDirection)in_stack_fffffffffffffd50,
                  (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                  SUB84((ulong)in_stack_fffffffffffffd58 >> 0x20,0));
  local_16c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (QFlagsStorage<Qt::AlignmentFlag>)
       QFlags<Qt::AlignmentFlag>::operator&
                 ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffd50,
                  (AlignmentFlag)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_16c);
  if (IVar3 == 0x20) {
    iVar4 = QRect::y((QRect *)0x5c7a24);
    pQVar12->vscroll = iVar4 + 1;
  }
  else if (IVar3 == 0x40) {
    in_stack_fffffffffffffdac = QRect::y((QRect *)0x5c79e0);
    iVar4 = QRect::height((QRect *)in_stack_fffffffffffffd48);
    pQVar12->vscroll = ((in_stack_fffffffffffffdac + iVar4) - local_bc) + -1;
  }
  else {
    in_stack_fffffffffffffda8 = QRect::y((QRect *)0x5c7a4c);
    iVar4 = QRect::height((QRect *)in_stack_fffffffffffffd48);
    pQVar12->vscroll = in_stack_fffffffffffffda8 + ((iVar4 - local_bc) + 1) / 2;
  }
  local_17c = &DAT_aaaaaaaaaaaaaaaa;
  local_174 = &DAT_aaaaaaaaaaaaaaaa;
  iVar5 = QRect::x((QRect *)0x5c7aae);
  iVar5 = iVar5 + 2;
  iVar4 = pQVar12->vscroll;
  QRect::width((QRect *)in_stack_fffffffffffffd48);
  QRect::QRect(in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20),
               (int)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20),
               (int)in_stack_fffffffffffffd48);
  bVar1 = QLineEditPrivate::shouldShowPlaceholderText
                    ((QLineEditPrivate *)
                     CONCAT44(in_stack_fffffffffffffd64,
                              CONCAT13(in_stack_fffffffffffffd63,
                                       CONCAT12(in_stack_fffffffffffffd62,in_stack_fffffffffffffd60)
                                      )));
  if (bVar1) {
    bVar1 = QString::isEmpty((QString *)0x5c7b30);
    if (!bVar1) {
      uVar6 = QString::isRightToLeft();
      in_stack_fffffffffffffd94 = (uint)((uVar6 & 1) != 0);
      local_180.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)0xaaaaaaaa;
      QFlag::QFlag(local_188,pQVar12->alignment);
      QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper
                ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffd48,
                 (QFlag)(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
      local_180.super_QFlagsStorage<Qt::AlignmentFlag>.i =
           (QFlagsStorage<Qt::AlignmentFlag>)
           QStyle::visualAlignment
                     ((LayoutDirection)in_stack_fffffffffffffd50,
                      (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
                      SUB84((ulong)in_stack_fffffffffffffd58 >> 0x20,0));
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      QPalette::placeholderText((QPalette *)0x5c7beb);
      pQVar16 = QBrush::color((QBrush *)0x5c7bf3);
      local_78 = *(undefined1 **)pQVar16;
      local_70 = *(undefined1 **)((long)&pQVar16->ct + 4);
      local_190 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar17 = (QPen *)QPainter::pen();
      QPen::QPen((QPen *)&local_190,pQVar17);
      QPainter::setPen((QColor *)&local_80);
      QPainter::layoutDirection();
      QPainter::setLayoutDirection((LayoutDirection)&local_80);
      local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
      local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_198 = &DAT_aaaaaaaaaaaaaaaa;
      in_stack_fffffffffffffd98 = (QLineEditPrivate *)&pQVar12->placeholderText;
      QRect::width((QRect *)in_stack_fffffffffffffd48);
      QFontMetrics::elidedText
                ((QString *)&local_1a8,(TextElideMode)&local_b8,(int)in_stack_fffffffffffffd98,1);
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_180);
      QPainter::drawText((QRect *)&local_80,(int)&local_17c,(QString *)(ulong)IVar3,
                         (QRect *)&local_1a8);
      QPainter::setPen((QPen *)&local_80);
      QPainter::setLayoutDirection((LayoutDirection)&local_80);
      QString::~QString((QString *)0x5c7d4c);
      QPen::~QPen((QPen *)&local_190);
    }
  }
  QWidgetLineControl::cursorToX(in_stack_fffffffffffffd50);
  iVar7 = qRound(2.99474333954022e-317);
  QWidgetLineControl::naturalTextWidth(in_stack_fffffffffffffd48);
  iVar8 = qRound(2.99475914964088e-317);
  iVar8 = iVar8 + 1;
  iVar22 = iVar8;
  iVar9 = QRect::width((QRect *)in_stack_fffffffffffffd48);
  if (iVar9 < iVar22) {
    in_stack_fffffffffffffd80 = iVar7 - pQVar12->hscroll;
    iVar9 = QRect::width((QRect *)in_stack_fffffffffffffd48);
    if (in_stack_fffffffffffffd80 < iVar9) {
      if ((iVar7 - pQVar12->hscroll < 0) && (pQVar12->hscroll < iVar8)) {
        pQVar12->hscroll = iVar7;
      }
      else {
        in_stack_fffffffffffffd78 = iVar8 - pQVar12->hscroll;
        iVar7 = QRect::width((QRect *)in_stack_fffffffffffffd48);
        if (in_stack_fffffffffffffd78 < iVar7) {
          iVar7 = QRect::width((QRect *)in_stack_fffffffffffffd48);
          pQVar12->hscroll = (iVar8 - iVar7) + 1;
          in_stack_fffffffffffffd74 = iVar8;
        }
        else {
          local_1b4 = 0;
          piVar15 = qMax<int>(&local_1b4,&pQVar12->hscroll);
          pQVar12->hscroll = *piVar15;
        }
      }
    }
    else {
      iVar8 = QRect::width((QRect *)in_stack_fffffffffffffd48);
      pQVar12->hscroll = (iVar7 - iVar8) + 1;
      in_stack_fffffffffffffd7c = iVar7;
    }
  }
  else {
    local_1b0.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         Qt::operator|((enum_type)((ulong)in_stack_fffffffffffffd50 >> 0x20),
                       (enum_type)in_stack_fffffffffffffd50);
    QFlags<Qt::AlignmentFlag>::operator~((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffd50);
    local_1ac.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         QFlags<Qt::AlignmentFlag>::operator&
                   ((QFlags<Qt::AlignmentFlag> *)in_stack_fffffffffffffd50,
                    (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)SUB84(in_stack_fffffffffffffd58,0));
    in_stack_fffffffffffffd8c = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_1ac);
    if (in_stack_fffffffffffffd8c == 2) {
      iVar7 = QRect::width((QRect *)in_stack_fffffffffffffd48);
      pQVar12->hscroll = (iVar8 - iVar7) + 1;
    }
    else if (in_stack_fffffffffffffd8c == 4) {
      iVar7 = QRect::width((QRect *)in_stack_fffffffffffffd48);
      pQVar12->hscroll = (iVar8 - iVar7) / 2;
      in_stack_fffffffffffffd84 = iVar8;
    }
    else {
      pQVar12->hscroll = 0;
    }
  }
  QRect::topLeft((QRect *)in_stack_fffffffffffffd48);
  iVar7 = pQVar12->hscroll;
  iVar8 = QWidgetLineControl::ascent((QWidgetLineControl *)pQVar12->control);
  QFontMetrics::ascent();
  QPoint::QPoint((QPoint *)in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20)
                 ,(int)in_stack_fffffffffffffd48);
  ::operator-((QPoint *)
              CONCAT44(in_stack_fffffffffffffd64,
                       CONCAT13(in_stack_fffffffffffffd63,
                                CONCAT12(in_stack_fffffffffffffd62,in_stack_fffffffffffffd60))),
              (QPoint *)in_stack_fffffffffffffd58);
  QWidget::style((QWidget *)in_stack_fffffffffffffd48);
  pQVar18 = qt_styleSheet((QStyle *)0x5c809e);
  if (pQVar18 != (QStyleSheetStyle *)0x0) {
    QStyleSheetStyle::styleSheetPalette
              ((QStyleSheetStyle *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (QWidget *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
               (QStyleOption *)CONCAT44(in_stack_fffffffffffffd74,iVar7),
               (QPalette *)
               CONCAT44(iVar8,CONCAT13(in_stack_fffffffffffffd6b,
                                       CONCAT12(in_stack_fffffffffffffd6a,
                                                CONCAT11(in_stack_fffffffffffffd69,
                                                         in_stack_fffffffffffffd68)))));
  }
  QPalette::text((QPalette *)0x5c80e0);
  QBrush::color((QBrush *)0x5c80e8);
  QPainter::setPen((QColor *)&local_80);
  bVar2 = QWidgetLineControl::hasSelectedText(in_stack_fffffffffffffd50);
  bVar1 = false;
  bVar20 = 1;
  if ((!bVar2) &&
     (in_stack_fffffffffffffd6a = 0, bVar20 = in_stack_fffffffffffffd6a,
     ((byte)pQVar12->field_0x27c >> 2 & 1) != 0)) {
    QWidgetLineControl::inputMask
              ((QWidgetLineControl *)
               CONCAT44(iVar8,CONCAT13(1,(uint3)CONCAT11(in_stack_fffffffffffffd69,
                                                         in_stack_fffffffffffffd68))));
    bVar1 = true;
    bVar2 = QString::isEmpty((QString *)0x5c8175);
    in_stack_fffffffffffffd6a = 0;
    bVar20 = in_stack_fffffffffffffd6a;
    if (!bVar2) {
      bVar2 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar12->control);
      in_stack_fffffffffffffd6a = bVar2 ^ 0xff;
      bVar20 = in_stack_fffffffffffffd6a;
    }
  }
  bVar21 = bVar20;
  if (bVar1) {
    QString::~QString((QString *)0x5c81c2);
  }
  if ((bVar20 & 1) != 0) {
    QWidgetLineControl::palette((QWidgetLineControl *)pQVar12->control);
    bVar1 = QPalette::operator!=
                      ((QPalette *)in_stack_fffffffffffffd50,(QPalette *)in_stack_fffffffffffffd48);
    if (!bVar1) {
      pQVar13 = QWidgetLineControl::palette((QWidgetLineControl *)pQVar12->control);
      CVar10 = QPalette::currentColorGroup(pQVar13);
      CVar11 = QPalette::currentColorGroup((QPalette *)local_18);
      if (CVar10 == CVar11) goto LAB_005c8257;
    }
    QWidgetLineControl::setPalette(in_stack_fffffffffffffd50,(QPalette *)in_stack_fffffffffffffd48);
  }
LAB_005c8257:
  bVar1 = false;
  if (((byte)pQVar12->field_0x27c >> 2 & 1) != 0) {
    bVar2 = QWidgetLineControl::isReadOnly((QWidgetLineControl *)pQVar12->control);
    if (!bVar2) {
      QWidgetLineControl::inputMask
                ((QWidgetLineControl *)
                 CONCAT44(iVar8,CONCAT13(bVar21,CONCAT12(in_stack_fffffffffffffd6a,
                                                         CONCAT11(bVar20,in_stack_fffffffffffffd68))
                                        )));
      bVar1 = true;
      QString::isEmpty((QString *)0x5c82cc);
    }
  }
  if (bVar1) {
    QString::~QString((QString *)0x5c82ee);
  }
  this_00 = pQVar12->control;
  pQVar14 = QWidget::style((QWidget *)this_00);
  iVar7 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x52,local_68,in_RDI);
  QWidgetLineControl::setCursorWidth((QWidgetLineControl *)this_00,iVar7);
  this_01 = (QPainter *)&local_80;
  QWidgetLineControl::draw
            ((QWidgetLineControl *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
             (QPainter *)CONCAT44(iVar4,iVar5),(QPoint *)in_stack_fffffffffffffd98,
             (QRect *)CONCAT44(in_stack_fffffffffffffd94,iVar22),in_stack_fffffffffffffd8c);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_b8);
  QStyleOptionFrame::~QStyleOptionFrame((QStyleOptionFrame *)0x5c839e);
  QPalette::~QPalette((QPalette *)local_18);
  QPainter::~QPainter(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEdit::paintEvent(QPaintEvent *)
{
    Q_D(QLineEdit);
    QPainter p(this);
    QPalette pal = palette();

    QStyleOptionFrame panel;
    initStyleOption(&panel);
    style()->drawPrimitive(QStyle::PE_PanelLineEdit, &panel, &p, this);
    QRect r = style()->subElementRect(QStyle::SE_LineEditContents, &panel, this);
    r = r.marginsRemoved(d->effectiveTextMargins());
    p.setClipRect(r);

    QFontMetrics fm = fontMetrics();
    int fmHeight = 0;
    if (d->shouldShowPlaceholderText())
        fmHeight = fm.boundingRect(d->placeholderText).height();
    else
        fmHeight = fm.boundingRect(d->control->text() + d->control->preeditAreaText()).height();
    fmHeight = qMax(fmHeight, fm.height());

    Qt::Alignment va = QStyle::visualAlignment(d->control->layoutDirection(), QFlag(d->alignment));
    switch (va & Qt::AlignVertical_Mask) {
     case Qt::AlignBottom:
         d->vscroll = r.y() + r.height() - fmHeight - QLineEditPrivate::verticalMargin;
         break;
     case Qt::AlignTop:
         d->vscroll = r.y() + QLineEditPrivate::verticalMargin;
         break;
     default:
         //center
         d->vscroll = r.y() + (r.height() - fmHeight + 1) / 2;
         break;
    }
    QRect lineRect(r.x() + QLineEditPrivate::horizontalMargin, d->vscroll,
                   r.width() - 2 * QLineEditPrivate::horizontalMargin, fmHeight);

    if (d->shouldShowPlaceholderText()) {
        if (!d->placeholderText.isEmpty()) {
            const Qt::LayoutDirection layoutDir = d->placeholderText.isRightToLeft() ? Qt::RightToLeft : Qt::LeftToRight;
            const Qt::Alignment alignPhText = QStyle::visualAlignment(layoutDir, QFlag(d->alignment));
            const QColor col = pal.placeholderText().color();
            QPen oldpen = p.pen();
            p.setPen(col);
            Qt::LayoutDirection oldLayoutDir = p.layoutDirection();
            p.setLayoutDirection(layoutDir);

            const QString elidedText = fm.elidedText(d->placeholderText, Qt::ElideRight, lineRect.width());
            p.drawText(lineRect, alignPhText, elidedText);
            p.setPen(oldpen);
            p.setLayoutDirection(oldLayoutDir);
        }
    }

    int cix = qRound(d->control->cursorToX());

    // horizontal scrolling. d->hscroll is the left indent from the beginning
    // of the text line to the left edge of lineRect. we update this value
    // depending on the delta from the last paint event; in effect this means
    // the below code handles all scrolling based on the textline (widthUsed),
    // the line edit rect (lineRect) and the cursor position (cix).
    int widthUsed = qRound(d->control->naturalTextWidth()) + 1;
    if (widthUsed <= lineRect.width()) {
        // text fits in lineRect; use hscroll for alignment
        switch (va & ~(Qt::AlignAbsolute|Qt::AlignVertical_Mask)) {
        case Qt::AlignRight:
            d->hscroll = widthUsed - lineRect.width() + 1;
            break;
        case Qt::AlignHCenter:
            d->hscroll = (widthUsed - lineRect.width()) / 2;
            break;
        default:
            // Left
            d->hscroll = 0;
            break;
        }
    } else if (cix - d->hscroll >= lineRect.width()) {
        // text doesn't fit, cursor is to the right of lineRect (scroll right)
        d->hscroll = cix - lineRect.width() + 1;
    } else if (cix - d->hscroll < 0 && d->hscroll < widthUsed) {
        // text doesn't fit, cursor is to the left of lineRect (scroll left)
        d->hscroll = cix;
    } else if (widthUsed - d->hscroll < lineRect.width()) {
        // text doesn't fit, text document is to the left of lineRect; align
        // right
        d->hscroll = widthUsed - lineRect.width() + 1;
    } else {
        //in case the text is bigger than the lineedit, the hscroll can never be negative
        d->hscroll = qMax(0, d->hscroll);
    }

    // the y offset is there to keep the baseline constant in case we have script changes in the text.
    // Needs to be kept in sync with QLineEditPrivate::adjustedControlRect
    QPoint topLeft = lineRect.topLeft() - QPoint(d->hscroll, d->control->ascent() - fm.ascent());

    // draw text, selections and cursors
#ifndef QT_NO_STYLE_STYLESHEET
    if (QStyleSheetStyle* cssStyle = qt_styleSheet(style())) {
        cssStyle->styleSheetPalette(this, &panel, &pal);
    }
#endif
    p.setPen(pal.text().color());

    int flags = QWidgetLineControl::DrawText;

#ifdef QT_KEYPAD_NAVIGATION
    if (!QApplicationPrivate::keypadNavigationEnabled() || hasEditFocus())
#endif
    if (d->control->hasSelectedText() || (d->cursorVisible && !d->control->inputMask().isEmpty() && !d->control->isReadOnly())){
        flags |= QWidgetLineControl::DrawSelections;
        // Palette only used for selections/mask and may not be in sync
        if (d->control->palette() != pal
           || d->control->palette().currentColorGroup() != pal.currentColorGroup())
            d->control->setPalette(pal);
    }

    // Asian users see an IM selection text as cursor on candidate
    // selection phase of input method, so the ordinary cursor should be
    // invisible if we have a preedit string. another condition is when inputmask
    // isn't empty,we don't need draw cursor,because cursor and character overlapping
    // area is white.
    if (d->cursorVisible && !d->control->isReadOnly() && d->control->inputMask().isEmpty())
        flags |= QWidgetLineControl::DrawCursor;

    d->control->setCursorWidth(style()->pixelMetric(QStyle::PM_TextCursorWidth, &panel, this));
    d->control->draw(&p, topLeft, r, flags);

}